

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O1

string * __thiscall
websocketpp::transport::asio::socket::socket_category::message_abi_cxx11_
          (string *__return_storage_ptr__,socket_category *this,int value)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(value) {
  case 1:
    pcVar2 = "Security policy error";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Socket component error";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Invalid state";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Invalid or empty TLS context supplied";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "TLS handshake timed out";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Pass through from socket policy";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Required tls_init handler not present.";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "TLS handshake failed";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Failed to set TLS SNI hostname";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int value) const {
        switch(value) {
            case error::security:
                return "Security policy error";
            case error::socket:
                return "Socket component error";
            case error::invalid_state:
                return "Invalid state";
            case error::invalid_tls_context:
                return "Invalid or empty TLS context supplied";
            case error::tls_handshake_timeout:
                return "TLS handshake timed out";
            case error::pass_through:
                return "Pass through from socket policy";
            case error::missing_tls_init_handler:
                return "Required tls_init handler not present.";
            case error::tls_handshake_failed:
                return "TLS handshake failed";
            case error::tls_failed_sni_hostname:
                return "Failed to set TLS SNI hostname";
            default:
                return "Unknown";
        }
    }